

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse(Parser *this,char *infile)

{
  iterator iVar1;
  reference ptVar2;
  DatalogProgram *this_00;
  exception e;
  char *infile_local;
  Parser *this_local;
  
  Scanner::scan(this->s,infile);
  std::vector<tok,_std::allocator<tok>_>::operator=(&this->toks,&this->s->toks);
  iVar1 = std::vector<tok,_std::allocator<tok>_>::begin(&this->toks);
  (this->it)._M_current = iVar1._M_current;
  ptVar2 = __gnu_cxx::__normal_iterator<tok_*,_std::vector<tok,_std::allocator<tok>_>_>::operator*
                     (&this->it);
  tok::operator=(&this->curr,ptVar2);
  this_00 = (DatalogProgram *)operator_new(0x90);
  (this_00->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this_00->domain)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(this_00->domain)._M_t._M_impl = 0;
  *(undefined8 *)&(this_00->domain)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this_00->queries).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->queries).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->facts).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->queries).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->facts).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->facts).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->schemes).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->schemes).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->schemes).super__Vector_base<Predicate_*,_std::allocator<Predicate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DatalogProgram::DatalogProgram(this_00);
  this->prog = this_00;
  datalogProgram(this);
  match(this,END_FILE);
  return;
}

Assistant:

void Parser::parse(char * infile){
	try {
		s->scan(infile);
		toks = s->toks;

		it = toks.begin();
		curr = *it;
		prog = new DatalogProgram();
		// Predicate* p = new Predicate("BAR");
		// p->params.push_back(new Parameter((string)"FOO"));
		// prog->addScheme(p);
		datalogProgram();
//		cout << prog->toString() << endl;
		match(END_FILE);
//		cout << prog->toString() << endl;
	}
	catch (exception e) {
		throw;
	}
}